

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::DisplayComponents(cmComputeLinkDepends *this)

{
  size_type __n;
  FILE *pFVar1;
  bool bVar2;
  pointer pcVar3;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *this_00;
  NodeList *pNVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  reference puVar5;
  undefined8 uVar6;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_02;
  reference this_03;
  size_t sVar7;
  reference pvVar8;
  size_t i_1;
  cmGraphEdge *oi;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  EdgeList *__range2_1;
  EdgeList *ol;
  size_t i;
  const_iterator __end2;
  const_iterator __begin2;
  NodeList *__range2;
  NodeList *nl;
  size_t c;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *components;
  cmComputeLinkDepends *this_local;
  
  fprintf(_stderr,"The strongly connected components are:\n");
  pcVar3 = std::unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>::
           operator->(&this->CCG);
  this_00 = cmComputeComponentGraph::GetComponents(pcVar3);
  nl = (NodeList *)0x0;
  while( true ) {
    pNVar4 = (NodeList *)
             std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::size(this_00);
    if (pNVar4 <= nl) break;
    fprintf(_stderr,"Component (%zu):\n",nl);
    this_01 = &std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::operator[]
                         (this_00,(size_type)nl)->
               super_vector<unsigned_long,_std::allocator<unsigned_long>_>;
    __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_01);
    i = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_01);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)&i);
      if (!bVar2) break;
      puVar5 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end2);
      pFVar1 = _stderr;
      __n = *puVar5;
      std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
      ::operator[](&this->EntryList,__n);
      uVar6 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"  item %zu [%s]\n",__n,uVar6);
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end2);
    }
    pcVar3 = std::unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
             ::operator->(&this->CCG);
    this_02 = &cmComputeComponentGraph::GetComponentGraphEdges(pcVar3,(size_t)nl)->
               super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
    __end2_1 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin(this_02);
    oi = (cmGraphEdge *)std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(this_02);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                          *)&oi);
      pFVar1 = _stderr;
      if (!bVar2) break;
      this_03 = __gnu_cxx::
                __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                ::operator*(&__end2_1);
      sVar7 = cmGraphEdge::operator_cast_to_unsigned_long(this_03);
      fprintf(_stderr,"  followed by Component (%zu)\n",sVar7);
      __gnu_cxx::
      __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
      ::operator++(&__end2_1);
    }
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->ComponentOrder,(size_type)nl);
    fprintf(pFVar1,"  topo order index %zu\n",*pvVar8);
    nl = (NodeList *)
         ((long)&(nl->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start + 1);
  }
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void cmComputeLinkDepends::DisplayComponents()
{
  fprintf(stderr, "The strongly connected components are:\n");
  std::vector<NodeList> const& components = this->CCG->GetComponents();
  for (size_t c = 0; c < components.size(); ++c) {
    fprintf(stderr, "Component (%zu):\n", c);
    NodeList const& nl = components[c];
    for (size_t i : nl) {
      fprintf(stderr, "  item %zu [%s]\n", i,
              this->EntryList[i].Item.Value.c_str());
    }
    EdgeList const& ol = this->CCG->GetComponentGraphEdges(c);
    for (cmGraphEdge const& oi : ol) {
      size_t i = oi;
      fprintf(stderr, "  followed by Component (%zu)\n", i);
    }
    fprintf(stderr, "  topo order index %zu\n", this->ComponentOrder[c]);
  }
  fprintf(stderr, "\n");
}